

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf_rule
          (CycleBreaking<covenant::Sym> *this,CFG *g,int lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rule,
          unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
          *new_non_terminals,set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  bool bVar1;
  bool bVar2;
  pointer pSVar3;
  pointer pSVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  emplace_return eVar8;
  int curr_nt;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> terminal_symbols;
  Rule new_rr;
  Rule new_r;
  int local_f4;
  Sym local_f0;
  int local_ec;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_e8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  *local_c8;
  undefined1 local_c0 [16];
  pointer local_b0;
  iterator iStack_a8;
  Sym *local_a0;
  undefined1 local_98 [16];
  pointer local_88;
  iterator iStack_80;
  Sym *local_78;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *local_70;
  shared_count *local_68;
  CycleBreaking<covenant::Sym> *local_60;
  set<int,_std::less<int>,_std::allocator<int>_> *local_58;
  element_type *local_50;
  shared_count local_48;
  element_type *local_40;
  shared_count local_38;
  
  local_f4 = 0;
  local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ec = lhs;
  local_c8 = &new_non_terminals->table_;
  local_60 = this;
  local_58 = group_set;
  bVar2 = findNextNonTerminal(this,rule,group_set,&local_e8,&local_f4);
  local_98._0_8_ = (g->_tfac).px;
  local_38.pi_ = (g->_tfac).pn.pi_;
  local_68 = (shared_count *)(local_98 + 8);
  if (local_38.pi_ == (sp_counted_base *)0x0) {
    local_98._8_8_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
    UNLOCK();
    local_98._8_8_ = local_38.pi_;
    if (local_38.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
      UNLOCK();
    }
  }
  local_88 = (pointer)0x0;
  iStack_80._M_current = (Sym *)0x0;
  local_78 = (Sym *)0x0;
  local_40 = (element_type *)local_98._0_8_;
  boost::detail::shared_count::~shared_count(&local_38);
  if (local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pSVar3 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar4 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = 0;
    uVar6 = 1;
    do {
      local_c0._0_4_ = pSVar3[uVar5].x;
      if (iStack_80._M_current == local_78) {
        std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
        _M_realloc_insert<covenant::Sym_const&>
                  ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_88,iStack_80,
                   (Sym *)local_c0);
        pSVar3 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar4 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        (iStack_80._M_current)->x = pSVar3[uVar5].x;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      bVar1 = uVar6 < (ulong)((long)pSVar4 - (long)pSVar3 >> 2);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  if (bVar2) {
    eVar8 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                        *)local_c8,&local_ec);
    iVar7 = *(int *)((long)&((eVar8.first.node_.node_)->value_base_).data_.data_ + 4);
    local_c0._0_4_ = iVar7;
    if (iStack_80._M_current == local_78) {
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_88,iStack_80,
                 (Sym *)local_c0);
    }
    else {
      (iStack_80._M_current)->x = iVar7;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
    CFG::prod(g,(Sym)(local_ec * 2 + 1),(Rule *)local_98);
  }
  else {
    iVar7 = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
            super__Vector_impl_data._M_start[local_f4].x;
    local_c0._0_4_ = iVar7;
    if (iStack_80._M_current == local_78) {
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_88,iStack_80,
                 (Sym *)local_c0);
    }
    else {
      (iStack_80._M_current)->x = iVar7;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
    CFG::prod(g,(Sym)(local_ec * 2 + 1),(Rule *)local_98);
    iVar7 = local_f4;
    local_f4 = local_f4 + 1;
    local_70 = rule;
    do {
      if (local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      bVar2 = findNextNonTerminal(local_60,rule,local_58,&local_e8,&local_f4);
      local_c0._0_8_ = (g->_tfac).px;
      local_48.pi_ = (g->_tfac).pn.pi_;
      if (local_48.pi_ == (sp_counted_base *)0x0) {
        local_c0._8_8_ = (sp_counted_base *)0x0;
      }
      else {
        LOCK();
        (local_48.pi_)->use_count_ = (local_48.pi_)->use_count_ + 1;
        UNLOCK();
        local_c0._8_8_ = local_48.pi_;
        if (local_48.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_48.pi_)->use_count_ = (local_48.pi_)->use_count_ + 1;
          UNLOCK();
        }
      }
      local_b0 = (pointer)0x0;
      iStack_a8._M_current = (Sym *)0x0;
      local_a0 = (Sym *)0x0;
      local_50 = (element_type *)local_c0._0_8_;
      boost::detail::shared_count::~shared_count(&local_48);
      if (local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pSVar3 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar4 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = 0;
        uVar6 = 1;
        do {
          local_f0.x = pSVar3[uVar5].x;
          if (iStack_a8._M_current == local_a0) {
            std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
            _M_realloc_insert<covenant::Sym_const&>
                      ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_b0,iStack_a8,
                       &local_f0);
            pSVar3 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pSVar4 = local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iStack_a8._M_current)->x = local_f0.x;
            iStack_a8._M_current = iStack_a8._M_current + 1;
          }
          bVar1 = uVar6 < (ulong)((long)pSVar4 - (long)pSVar3 >> 2);
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar1);
      }
      rule = local_70;
      if (bVar2) {
        eVar8 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                ::try_emplace_unique<int_const&>
                          ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                            *)local_c8,&local_ec);
        rule = local_70;
        local_f0.x = *(int *)((long)&((eVar8.first.node_.node_)->value_base_).data_.data_ + 4);
        if (iStack_a8._M_current == local_a0) {
          std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
          _M_realloc_insert<covenant::Sym_const&>
                    ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_b0,iStack_a8,
                     &local_f0);
        }
        else {
          (iStack_a8._M_current)->x = local_f0.x;
          iStack_a8._M_current = iStack_a8._M_current + 1;
        }
        local_f0.x = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                     _M_impl.super__Vector_impl_data._M_start[iVar7].x >> 1;
        eVar8 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
                ::try_emplace_unique<int>(local_c8,&local_f0.x);
        CFG::prod(g,(Sym)*(int *)((long)&((eVar8.first.node_.node_)->value_base_).data_.data_ + 4),
                  (Rule *)local_c0);
      }
      else {
        pSVar3 = (local_70->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_f0.x = pSVar3[local_f4].x;
        if (iStack_a8._M_current == local_a0) {
          std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
          _M_realloc_insert<covenant::Sym_const&>
                    ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_b0,iStack_a8,
                     &local_f0);
          pSVar3 = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        }
        else {
          (iStack_a8._M_current)->x = local_f0.x;
          iStack_a8._M_current = iStack_a8._M_current + 1;
        }
        local_f0.x = pSVar3[iVar7].x >> 1;
        eVar8 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
                ::try_emplace_unique<int>(local_c8,&local_f0.x);
        CFG::prod(g,(Sym)*(int *)((long)&((eVar8.first.node_.node_)->value_base_).data_.data_ + 4),
                  (Rule *)local_c0);
        iVar7 = local_f4;
        local_f4 = local_f4 + 1;
      }
      if (local_b0 != (pointer)0x0) {
        operator_delete(local_b0);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_c0 + 8));
    } while (!bVar2);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88);
  }
  boost::detail::shared_count::~shared_count(local_68);
  if (local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cycle_breaking_transf_rule (CFG &g, 
                                   const int lhs, 
                                   const vector<EdgeSym> rule, 
                                   boost::unordered_map<int, EdgeSym> new_non_terminals,
                                   const set<int> group_set)
  {
    int curr_nt=0;
    vector<EdgeSym> terminal_symbols;
    bool finished = findNextNonTerminal (rule, group_set, 
                                         terminal_symbols, curr_nt);
    Rule new_r (g.getTermFactory ());
    for(unsigned i=0; i< terminal_symbols.size(); i++)
      new_r << terminal_symbols[i];
      
    if (finished)
    {
      // the rule has only terminal symbols
      new_r << new_non_terminals[lhs];
      g.prod(EdgeSym::mkVar(lhs), new_r);

      // LOG ("abstraction", 
      //      cout << "\t\trule only with terminal symbols: ";
      //      g.printProduction(cout, lhs); cout << endl);

      return;
    }
    else
    {
      // we found the first nonterminal symbol
      new_r << rule[curr_nt];
      g.prod(EdgeSym::mkVar(lhs), new_r);	

      // LOG ("abstraction" , 
      //      cout << "\t\tAdded rule from first nonterminal: ";
      //      g.printProduction(cout, lhs); cout << endl);

    }
    int prev_nt = curr_nt;
    curr_nt++;
    while (!finished)
    {
      terminal_symbols.clear();
      finished = findNextNonTerminal(rule, group_set, 
                                     terminal_symbols, curr_nt);
      Rule new_rr (g.getTermFactory ());
      for(unsigned i=0; i< terminal_symbols.size(); i++)
        new_rr << terminal_symbols[i];
      if (!finished)
      {
        // intermediate non terminal symbol
        new_rr << rule[curr_nt];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tintermediate nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        prev_nt = curr_nt;
        curr_nt++;
      }
      else
      {
        // last non terminal symbol
        new_rr << new_non_terminals[lhs];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tlast nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        break;
      }
    }
  }